

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  pointer pcVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar8;
  pointer pbVar9;
  cmGeneratedFileStream devses;
  cmGeneratedFileStream fout;
  undefined1 auStack_518 [6];
  byte local_512;
  byte local_511;
  long *local_510;
  char *local_508;
  long local_500 [2];
  string *local_4f0;
  string *local_4e8;
  string local_4e0;
  undefined1 local_4c0 [32];
  byte abStack_4a0 [552];
  undefined1 local_278 [584];
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_4c0._0_8_ = local_4c0 + 0x10;
    pcVar1 = (projectDir->_M_dataplus)._M_p;
    local_4e8 = executable;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4c0,pcVar1,pcVar1 + projectDir->_M_string_length);
    std::__cxx11::string::append(local_4c0);
    local_511 = cmsys::SystemTools::FileExists((char *)local_4c0._0_8_);
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    local_4c0._0_8_ = local_4c0 + 0x10;
    pcVar1 = (projectDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4c0,pcVar1,pcVar1 + projectDir->_M_string_length);
    std::__cxx11::string::append(local_4c0);
    bVar3 = cmsys::SystemTools::FileExists((char *)local_4c0._0_8_);
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_4c0._0_8_ = local_4c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"C","");
    local_4f0 = cmakeFilePattern;
    bVar4 = cmGlobalGenerator::GetLanguageEnabled(pcVar2,(string *)local_4c0);
    bVar5 = true;
    if (!bVar4) {
      pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"CXX","");
      bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar2,&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_4c0._0_8_ = local_4c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"Fortran","");
    local_512 = cmGlobalGenerator::GetLanguageEnabled(pcVar2,(string *)local_4c0);
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    local_510 = local_500;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"C++","");
    if (local_512 == 1 && bVar5 == false) {
      std::__cxx11::string::_M_replace((ulong)&local_510,0,local_508,0x4b7785);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version = \'1.0\'?>\n<kdevelop>\n  <general>\n  <author></author>\n  <email></email>\n  <version>$VERSION$</version>\n  <projectmanagement>KDevCustomProject</projectmanagement>\n  <primarylanguage>"
               ,0xc2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(char *)local_510,(long)local_508);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"</primarylanguage>\n  <ignoreparts/>\n  <projectdirectory>",0x38);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(projectDir->_M_dataplus)._M_p,projectDir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</projectdirectory>\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  <absoluteprojectpath>true</absoluteprojectpath>\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  <secondaryLanguages>\n",0x17);
    if ((bVar5 & local_512) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"     <language>Fortran</language>\n",0x22);
    }
    if (bVar5 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"     <language>C</language>\n",0x1c);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  </secondaryLanguages>\n",0x18);
    if ((bVar3 | local_511) == 1) {
      pcVar8 = "  <versioncontrol>kdevcvsservice</versioncontrol>\n";
      if (local_511 != 0) {
        pcVar8 = "  <versioncontrol>kdevsubversion</versioncontrol>\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar8,0x32);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  </general>\n  <kdevcustomproject>\n    <filelistdirectory>",
               0x3a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(outputDir->_M_dataplus)._M_p,
                        outputDir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"</filelistdirectory>\n    <run>\n      <mainprogram>",0x32);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(local_4e8->_M_dataplus)._M_p,local_4e8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "</mainprogram>\n      <directoryradio>custom</directoryradio>\n      <customdirectory>"
               ,0x54);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(outputDir->_M_dataplus)._M_p,outputDir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "</customdirectory>\n      <programargs></programargs>\n      <terminal>false</terminal>\n      <autocompile>true</autocompile>\n      <envvars/>\n    </run>\n    <build>\n      <buildtool>make</buildtool>\n"
               ,0xc6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      <builddir>",0x10)
    ;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(outputDir->_M_dataplus)._M_p,
                        outputDir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</builddir>\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "    </build>\n    <make>\n      <abortonerror>false</abortonerror>\n      <numberofjobs>1</numberofjobs>\n      <dontact>false</dontact>\n      <makebin>"
               ,0x94);
    this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators
                ).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->Makefile;
    local_4c0._0_8_ = local_4c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"CMAKE_MAKE_PROGRAM","");
    pcVar8 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_4c0);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)(auStack_518 + (long)*(_func_int **)(local_278._0_8_ + -0x18)) + 0x2a0);
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               " </makebin>\n      <selectedenvironment>default</selectedenvironment>\n      <environments>\n        <default>\n          <envvar value=\"1\" name=\"VERBOSE\" />\n          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n        </default>\n      </environments>\n    </make>\n"
               ,0x106);
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"    <blacklist>\n",0x10);
    pbVar9 = (this->Blacklist).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar9 != (this->Blacklist).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      <path>",0xc);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</path>\n",8);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (this->Blacklist).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"    </blacklist>\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "  </kdevcustomproject>\n  <kdevfilecreate>\n    <filetypes/>\n    <useglobaltypes>\n      <type ext=\"ui\" />\n      <type ext=\"cpp\" />\n      <type ext=\"h\" />\n    </useglobaltypes>\n  </kdevfilecreate>\n  <kdevdoctreeview>\n    <projectdoc>\n      <userdocDir>html/</userdocDir>\n      <apidocDir>html/</apidocDir>\n    </projectdoc>\n    <ignoreqt_xml/>\n    <ignoredoxygen/>\n    <ignorekdocs/>\n    <ignoretocs/>\n    <ignoredevhelp/>\n  </kdevdoctreeview>\n"
               ,0x1b9);
    if (bVar5 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "  <cppsupportpart>\n    <filetemplates>\n      <interfacesuffix>.h</interfacesuffix>\n      <implementationsuffix>.cpp</implementationsuffix>\n    </filetemplates>\n  </cppsupportpart>\n  <kdevcppsupport>\n    <codecompletion>\n      <includeGlobalFunctions>true</includeGlobalFunctions>\n      <includeTypes>true</includeTypes>\n      <includeEnums>true</includeEnums>\n      <includeTypedefs>false</includeTypedefs>\n      <automaticCodeCompletion>true</automaticCodeCompletion>\n      <automaticArgumentsHint>true</automaticArgumentsHint>\n      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n      <codeCompletionDelay>250</codeCompletionDelay>\n      <argumentsHintDelay>400</argumentsHintDelay>\n      <headerCompletionDelay>250</headerCompletionDelay>\n    </codecompletion>\n    <references/>\n  </kdevcppsupport>\n"
                 ,0x330);
    }
    if (local_512 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "  <kdevfortransupport>\n    <ftnchek>\n      <division>false</division>\n      <extern>false</extern>\n      <declare>false</declare>\n      <pure>false</pure>\n      <argumentsall>false</argumentsall>\n      <commonall>false</commonall>\n      <truncationall>false</truncationall>\n      <usageall>false</usageall>\n      <f77all>false</f77all>\n      <portabilityall>false</portabilityall>\n      <argumentsonly/>\n      <commononly/>\n      <truncationonly/>\n      <usageonly/>\n      <f77only/>\n      <portabilityonly/>\n    </ftnchek>\n  </kdevfortransupport>\n"
                 ,0x224);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  <kdevfileview>\n    <groups>\n      <group pattern=\"",0x34);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(local_4f0->_M_dataplus)._M_p,
                        local_4f0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" name=\"CMake\" />\n",0x12);
    if (bVar5 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n      <group pattern=\"*.c\" name=\"C Sources\" />\n      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\"/>\n"
                 ,0xa8);
    }
    if (local_512 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95\" name=\"Fortran Sources\" />\n"
                 ,99);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </groups>\n    <tree>\n      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </tree>\n  </kdevfileview>\n</kdevelop>\n"
               ,0x121);
    if (sessionFilename->_M_string_length != 0) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_4c0,(sessionFilename->_M_dataplus)._M_p,false);
      if ((abStack_4a0[*(long *)(local_4c0._0_8_ + -0x18)] & 5) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4c0,
                   "<?xml version = \'1.0\' encoding = \'UTF-8\'?>\n<!DOCTYPE KDevPrjSession>\n<KDevPrjSession>\n <DocsAndViews NumberOfDocuments=\"1\" >\n  <Doc0 NumberOfViews=\"1\" URL=\"file://"
                   ,0xa3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_4c0,(fileToOpen->_M_dataplus)._M_p,
                            fileToOpen->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\" >\n   <View0 line=\"0\" Type=\"Source\" />\n  </Doc0>\n </DocsAndViews>\n</KDevPrjSession>\n"
                   ,0x55);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
    }
    if (local_510 != local_500) {
      operator_delete(local_510,local_500[0] + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator
::CreateNewProjectFile(const std::string& outputDir,
                       const std::string& projectDir,
                       const std::string& filename,
                       const std::string& executable,
                       const std::string& cmakeFilePattern,
                       const std::string& fileToOpen,
                       const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C")
                          || this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx)
    {
    primaryLanguage="Fortran77";
    }

  fout<<"<?xml version = '1.0'?>\n"
        "<kdevelop>\n"
        "  <general>\n"
        "  <author></author>\n"
        "  <email></email>\n"
        "  <version>$VERSION$</version>\n"
        "  <projectmanagement>KDevCustomProject</projectmanagement>\n"
        "  <primarylanguage>" << primaryLanguage << "</primarylanguage>\n"
        "  <ignoreparts/>\n"
        "  <projectdirectory>" << projectDir <<
        "</projectdirectory>\n";   //this one is important
  fout<<"  <absoluteprojectpath>true</absoluteprojectpath>\n"; //and this one

  // setup additional languages
  fout<<"  <secondaryLanguages>\n";
  if (enableFortran && enableCxx)
    {
    fout<<"     <language>Fortran</language>\n";
    }
  if (enableCxx)
    {
    fout<<"     <language>C</language>\n";
    }
  fout<<"  </secondaryLanguages>\n";

  if (hasSvn)
    {
    fout << "  <versioncontrol>kdevsubversion</versioncontrol>\n";
    }
  else if (hasCvs)
    {
    fout << "  <versioncontrol>kdevcvsservice</versioncontrol>\n";
    }

  fout<<"  </general>\n"
        "  <kdevcustomproject>\n"
        "    <filelistdirectory>" << outputDir <<
        "</filelistdirectory>\n"
        "    <run>\n"
        "      <mainprogram>" << executable << "</mainprogram>\n"
        "      <directoryradio>custom</directoryradio>\n"
        "      <customdirectory>"<<outputDir<<"</customdirectory>\n"
        "      <programargs></programargs>\n"
        "      <terminal>false</terminal>\n"
        "      <autocompile>true</autocompile>\n"
        "      <envvars/>\n"
        "    </run>\n"
        "    <build>\n"
        "      <buildtool>make</buildtool>\n"; //this one is important
  fout<<"      <builddir>"<<outputDir<<"</builddir>\n";  //and this one
  fout<<"    </build>\n"
        "    <make>\n"
        "      <abortonerror>false</abortonerror>\n"
        "      <numberofjobs>1</numberofjobs>\n"
        "      <dontact>false</dontact>\n"
        "      <makebin>" << this->GlobalGenerator->GetLocalGenerators()[0]->
            GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")
            << " </makebin>\n"
        "      <selectedenvironment>default</selectedenvironment>\n"
        "      <environments>\n"
        "        <default>\n"
        "          <envvar value=\"1\" name=\"VERBOSE\" />\n"
        "          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n"
        "        </default>\n"
        "      </environments>\n"
        "    </make>\n";

  fout<<"    <blacklist>\n";
  for(std::vector<std::string>::const_iterator dirIt=this->Blacklist.begin();
      dirIt != this->Blacklist.end();
      ++dirIt)
    {
    fout<<"      <path>" << *dirIt << "</path>\n";
    }
  fout<<"    </blacklist>\n";

  fout<<"  </kdevcustomproject>\n"
        "  <kdevfilecreate>\n"
        "    <filetypes/>\n"
        "    <useglobaltypes>\n"
        "      <type ext=\"ui\" />\n"
        "      <type ext=\"cpp\" />\n"
        "      <type ext=\"h\" />\n"
        "    </useglobaltypes>\n"
        "  </kdevfilecreate>\n"
        "  <kdevdoctreeview>\n"
        "    <projectdoc>\n"
        "      <userdocDir>html/</userdocDir>\n"
        "      <apidocDir>html/</apidocDir>\n"
        "    </projectdoc>\n"
        "    <ignoreqt_xml/>\n"
        "    <ignoredoxygen/>\n"
        "    <ignorekdocs/>\n"
        "    <ignoretocs/>\n"
        "    <ignoredevhelp/>\n"
        "  </kdevdoctreeview>\n";

  if (enableCxx)
    {
    fout<<"  <cppsupportpart>\n"
          "    <filetemplates>\n"
          "      <interfacesuffix>.h</interfacesuffix>\n"
          "      <implementationsuffix>.cpp</implementationsuffix>\n"
          "    </filetemplates>\n"
          "  </cppsupportpart>\n"
          "  <kdevcppsupport>\n"
          "    <codecompletion>\n"
          "      <includeGlobalFunctions>true</includeGlobalFunctions>\n"
          "      <includeTypes>true</includeTypes>\n"
          "      <includeEnums>true</includeEnums>\n"
          "      <includeTypedefs>false</includeTypedefs>\n"
          "      <automaticCodeCompletion>true</automaticCodeCompletion>\n"
          "      <automaticArgumentsHint>true</automaticArgumentsHint>\n"
          "      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n"
          "      <codeCompletionDelay>250</codeCompletionDelay>\n"
          "      <argumentsHintDelay>400</argumentsHintDelay>\n"
          "      <headerCompletionDelay>250</headerCompletionDelay>\n"
          "    </codecompletion>\n"
          "    <references/>\n"
          "  </kdevcppsupport>\n";
    }

  if (enableFortran)
    {
    fout<<"  <kdevfortransupport>\n"
          "    <ftnchek>\n"
          "      <division>false</division>\n"
          "      <extern>false</extern>\n"
          "      <declare>false</declare>\n"
          "      <pure>false</pure>\n"
          "      <argumentsall>false</argumentsall>\n"
          "      <commonall>false</commonall>\n"
          "      <truncationall>false</truncationall>\n"
          "      <usageall>false</usageall>\n"
          "      <f77all>false</f77all>\n"
          "      <portabilityall>false</portabilityall>\n"
          "      <argumentsonly/>\n"
          "      <commononly/>\n"
          "      <truncationonly/>\n"
          "      <usageonly/>\n"
          "      <f77only/>\n"
          "      <portabilityonly/>\n"
          "    </ftnchek>\n"
          "  </kdevfortransupport>\n";
    }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  fout<<"  <kdevfileview>\n"
        "    <groups>\n"
        "      <group pattern=\"" << cmakeFilePattern <<
        "\" name=\"CMake\" />\n";

  if (enableCxx)
    {
    fout<<"      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n"
          "      <group pattern=\"*.c\" name=\"C Sources\" />\n"
          "      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\""
          "/>\n";
    }

  if (enableFortran)
    {
    fout<<"      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;"
          "*.F95\" name=\"Fortran Sources\" />\n";
    }

  fout<<"      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </groups>\n"
        "    <tree>\n"
        "      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </tree>\n"
        "  </kdevfileview>\n"
        "</kdevelop>\n";

  if (sessionFilename.empty())
    {
    return;
    }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if(!devses)
    {
    return;
    }
  devses<<"<?xml version = '1.0' encoding = \'UTF-8\'?>\n"
          "<!DOCTYPE KDevPrjSession>\n"
          "<KDevPrjSession>\n"
          " <DocsAndViews NumberOfDocuments=\"1\" >\n"
          "  <Doc0 NumberOfViews=\"1\" URL=\"file://" << fileToOpen <<
          "\" >\n"
          "   <View0 line=\"0\" Type=\"Source\" />\n"
          "  </Doc0>\n"
          " </DocsAndViews>\n"
          "</KDevPrjSession>\n";
}